

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl.h
# Opt level: O0

void __thiscall
flatbuffers::SymbolTable<flatbuffers::Value>::~SymbolTable(SymbolTable<flatbuffers::Value> *this)

{
  Value *this_00;
  bool bVar1;
  reference ppVVar2;
  __normal_iterator<flatbuffers::Value_**,_std::vector<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>_>
  local_20;
  __normal_iterator<flatbuffers::Value_**,_std::vector<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>_>
  local_18;
  iterator it;
  SymbolTable<flatbuffers::Value> *this_local;
  
  it._M_current = (Value **)this;
  local_18._M_current =
       (Value **)
       std::vector<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>::begin(&this->vec);
  while( true ) {
    local_20._M_current =
         (Value **)
         std::vector<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>::end(&this->vec);
    bVar1 = __gnu_cxx::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    ppVVar2 = __gnu_cxx::
              __normal_iterator<flatbuffers::Value_**,_std::vector<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>_>
              ::operator*(&local_18);
    this_00 = *ppVVar2;
    if (this_00 != (Value *)0x0) {
      Value::~Value(this_00);
      operator_delete(this_00,0x48);
    }
    __gnu_cxx::
    __normal_iterator<flatbuffers::Value_**,_std::vector<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>_>
    ::operator++(&local_18);
  }
  std::vector<flatbuffers::Value_*,_std::allocator<flatbuffers::Value_*>_>::~vector(&this->vec);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Value_*>_>_>
  ::~map(&this->dict);
  return;
}

Assistant:

~SymbolTable() {
    for (auto it = vec.begin(); it != vec.end(); ++it) { delete *it; }
  }